

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfOrthographicCamera(OrthographicCamera *camera,json *o)

{
  char cVar1;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  OrthographicCamera *camera_local;
  
  local_18 = o;
  o_local = (json *)camera;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"zfar",&local_39);
  SerializeNumberProperty<double>(&local_38,*(double *)(o_local + 1),local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"znear",&local_71);
  SerializeNumberProperty<double>(&local_70,o_local[1].m_value.number_float,local_18);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"xmag",&local_99);
  SerializeNumberProperty<double>(&local_98,*(double *)o_local,local_18);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"ymag",&local_c1);
  SerializeNumberProperty<double>(&local_c0,(o_local->m_value).number_float,local_18);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  cVar1 = Value::Type((Value *)(o_local + 5));
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"extras",&local_e9);
    SerializeValue(&local_e8,(Value *)(o_local + 5),local_18);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  return;
}

Assistant:

static void SerializeGltfOrthographicCamera(const OrthographicCamera &camera,
                                            json &o) {
  SerializeNumberProperty("zfar", camera.zfar, o);
  SerializeNumberProperty("znear", camera.znear, o);
  SerializeNumberProperty("xmag", camera.xmag, o);
  SerializeNumberProperty("ymag", camera.ymag, o);

  if (camera.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", camera.extras, o);
  }
}